

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spreadhash.cpp
# Opt level: O1

void SS_mangle(uchar *key,uchar *ret_key,int nbytes)

{
  undefined4 uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [64];
  ulong uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [64];
  undefined1 auVar20 [32];
  
  uVar9 = 0;
  if (3 < nbytes) {
    uVar9 = 0;
    auVar17 = vpmovsxbq_avx2(ZEXT416(0x18100800));
    do {
      auVar14 = vpshufb_avx(ZEXT416(*(uint *)(key + uVar9)),SUB6416(ZEXT464(0x10203),0));
      auVar15 = vpmovzxbq_avx2(auVar14);
      auVar15 = vpsllvq_avx2(auVar15,auVar17);
      auVar14 = vpor_avx(auVar15._0_16_,auVar15._16_16_);
      auVar6 = vpshufd_avx(auVar14,0xee);
      vpor_avx(auVar14,auVar6);
      auVar15 = vpbroadcastq_avx512vl();
      auVar15 = vpsrlvq_avx2(auVar15,auVar17);
      auVar14 = vpmovqb_avx512vl(auVar15);
      *(int *)(ret_key + uVar9) = auVar14._0_4_;
      uVar9 = uVar9 + 4;
    } while ((nbytes & 0xfffffffc) != uVar9);
  }
  iVar10 = nbytes % 4;
  if (0 < iVar10) {
    auVar16 = vpbroadcastq_avx512vl();
    auVar17 = vpmovsxbq_avx2(ZEXT416(0x3020100));
    lVar11 = 0;
    auVar15 = vpermq_avx2(auVar16,0x1b);
    auVar18._8_8_ = 4;
    auVar18._0_8_ = 4;
    auVar18._16_8_ = 4;
    auVar18._24_8_ = 4;
    auVar8 = ZEXT1664((undefined1  [16])0x0);
    do {
      auVar7 = auVar17;
      auVar19 = auVar8;
      auVar17 = vpermq_avx2(auVar7,0x1b);
      uVar12 = vpcmpuq_avx512vl(auVar17,auVar15,2);
      uVar12 = uVar12 & 0xf;
      auVar14 = vmovdqu8_avx512vl(*(undefined1 (*) [16])
                                   (key + lVar11 + (long)((int)uVar9 + iVar10) + -4));
      auVar14 = vpshufb_avx(ZEXT416(CONCAT13((char)(uVar12 >> 3) * auVar14[3],
                                             CONCAT12(((byte)(uVar12 >> 2) & 1) * auVar14[2],
                                                      CONCAT11(((byte)(uVar12 >> 1) & 1) *
                                                               auVar14[1],
                                                               ((byte)uVar12 & 1) * auVar14[0])))),
                            SUB6416(ZEXT464(0x10203),0));
      auVar17 = vpmovzxbq_avx2(auVar14);
      auVar20 = vpsllq_avx2(auVar7,3);
      auVar17 = vpsllvq_avx2(auVar17,auVar20);
      auVar20 = vpor_avx2(auVar17,auVar19._0_32_);
      auVar17 = vpaddq_avx2(auVar7,auVar18);
      lVar11 = lVar11 + -4;
      auVar8 = ZEXT3264(auVar20);
    } while (-lVar11 != (ulong)(iVar10 + 3U & 0xfffffffc));
    uVar12 = vpcmpuq_avx512vl(auVar7,auVar16,2);
    uVar12 = uVar12 & 0xf;
    auVar17 = vmovdqa64_avx512vl(auVar20);
    bVar5 = (bool)((byte)uVar12 & 1);
    auVar14._0_8_ = (ulong)bVar5 * auVar17._0_8_ | (ulong)!bVar5 * auVar19._0_8_;
    bVar5 = (bool)((byte)(uVar12 >> 1) & 1);
    auVar14._8_8_ = (ulong)bVar5 * auVar17._8_8_ | (ulong)!bVar5 * auVar19._8_8_;
    bVar5 = (bool)((byte)(uVar12 >> 2) & 1);
    auVar15._16_8_ = (ulong)bVar5 * auVar17._16_8_ | (ulong)!bVar5 * auVar19._16_8_;
    auVar15._0_16_ = auVar14;
    auVar15._24_8_ = (uVar12 >> 3) * auVar17._24_8_ | (ulong)!SUB81(uVar12 >> 3,0) * auVar19._24_8_;
    auVar14 = vpor_avx(auVar14,auVar15._16_16_);
    auVar6 = vpshufd_avx(auVar14,0xee);
    vpor_avx(auVar14,auVar6);
  }
  if (0 < iVar10) {
    auVar15 = vpbroadcastq_avx512vl();
    auVar16 = vpbroadcastq_avx512vl();
    auVar17 = vpmovsxbq_avx2(ZEXT416(0x3020100));
    uVar12 = 0;
    auVar20._8_8_ = 4;
    auVar20._0_8_ = 4;
    auVar20._16_8_ = 4;
    auVar20._24_8_ = 4;
    do {
      uVar13 = vpcmpuq_avx512vl(auVar17,auVar15,2);
      uVar13 = uVar13 & 0xf;
      auVar18 = vpsllq_avx2(auVar17,3);
      auVar18 = vpsrlvq_avx2(auVar16,auVar18);
      auVar14 = vpmovqb_avx512vl(auVar18);
      uVar1 = *(undefined4 *)(ret_key + uVar12 + (uVar9 & 0xffffffff));
      bVar5 = (bool)((byte)uVar13 & 1);
      bVar2 = (bool)((byte)(uVar13 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar13 >> 2) & 1);
      bVar4 = SUB81(uVar13 >> 3,0);
      *(uint *)(ret_key + uVar12 + (uVar9 & 0xffffffff)) =
           CONCAT13(bVar4 * auVar14[3] | !bVar4 * (char)((uint)uVar1 >> 0x18),
                    CONCAT12(bVar3 * auVar14[2] | !bVar3 * (char)((uint)uVar1 >> 0x10),
                             CONCAT11(bVar2 * auVar14[1] | !bVar2 * (char)((uint)uVar1 >> 8),
                                      bVar5 * auVar14[0] | !bVar5 * (char)uVar1)));
      uVar12 = uVar12 + 4;
      auVar17 = vpaddq_avx2(auVar17,auVar20);
    } while ((iVar10 + 3U & 0xfffffffc) != uVar12);
  }
  return;
}

Assistant:

void SS_mangle(const unsigned char* key, unsigned char* ret_key,
	int nbytes) {
	int i, j;
	unsigned long long new_key;
	for (j = 0; j < nbytes / 4; ++j) {
		new_key = 0;
		for (i = 0; i < 4; ++i) {
			uint64_t tmp = 0;
			tmp = key[4 - i - 1 + j * 4];
			new_key |= tmp << (i * 8);
		}
		new_key = (new_key * 2083697005) & (0xffffffffffffffff);
		for (i = 0; i < 4; ++i) {
			ret_key[i + 4 * j] = (new_key >> (i * 8)) & 0xff;
		}
	}

	int remain = nbytes % 4;
	new_key = 0;
	for (i = 0; i < remain; ++i) {
		uint64_t tmp = 0;
		tmp = key[remain - i - 1 + j * 4];
		new_key |= tmp << (i * 8);
	}
	new_key = (new_key * 2083697005) & (0xffffffffffffffff);
	for (i = 0; i < remain; ++i) {
		ret_key[i + 4 * j] = (new_key >> (i * 8)) & 0xff;
	}
}